

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::InsertionSort<Memory::WriteBarrierPtr<void>>
               (WriteBarrierPtr<void> *list,uint32 length,CompareVarsInfo *cvInfo)

{
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *p_Var1;
  bool bVar2;
  WriteBarrierPtr<void> local_40;
  WriteBarrierPtr<void> item;
  uint32 upperBound;
  uint32 insertPoint;
  uint32 lowerBound;
  uint32 sortedCount;
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *compareType;
  CompareVarsInfo *cvInfo_local;
  uint32 length_local;
  WriteBarrierPtr<void> *list_local;
  
  p_Var1 = cvInfo->compareType;
  insertPoint = 1;
  item.ptr._4_4_ = 0;
  item.ptr._0_4_ = 0;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&local_40);
  for (; insertPoint < length; insertPoint = insertPoint + 1) {
    Memory::WriteBarrierPtr<void>::operator=(&local_40,list + insertPoint);
    item.ptr._0_4_ = insertPoint;
    item.ptr._4_4_ = insertPoint - 1;
    upperBound = 0;
    while( true ) {
      bVar2 = (*p_Var1)(cvInfo,&local_40,list + item.ptr._4_4_);
      if (bVar2) {
        item.ptr._0_4_ = item.ptr._4_4_;
      }
      else {
        upperBound = item.ptr._4_4_ + 1;
      }
      if ((uint)item.ptr <= upperBound) break;
      item.ptr._4_4_ = upperBound + ((uint)item.ptr - upperBound >> 1);
    }
    for (item.ptr._4_4_ = insertPoint; upperBound < item.ptr._4_4_;
        item.ptr._4_4_ = item.ptr._4_4_ - 1) {
      Memory::WriteBarrierPtr<void>::operator=(list + item.ptr._4_4_,list + (item.ptr._4_4_ - 1));
    }
    Memory::WriteBarrierPtr<void>::operator=(list + upperBound,&local_40);
  }
  return;
}

Assistant:

void JavascriptArray::InsertionSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        uint32 sortedCount = 1, lowerBound = 0, insertPoint = 0, upperBound = 0;
        T item;
        while (sortedCount < length)
        {
            item = list[sortedCount];
            upperBound = sortedCount;
            insertPoint = sortedCount - 1; // this lets us check for already ordered first
            lowerBound = 0;
            for (;;)
            {
                if (compareType (cvInfo, &item, &list[insertPoint]) )
                {
                    upperBound = insertPoint;
                }
                else
                {
                    lowerBound = insertPoint + 1;
                }
                if (lowerBound >= upperBound)
                {
                    break;
                }
                insertPoint = lowerBound + ((upperBound - lowerBound) / 2);
            }
            insertPoint = sortedCount;
            while (insertPoint > lowerBound)
            {
                list[insertPoint] = list[insertPoint - 1];
                --insertPoint;
            }
            list[lowerBound] = item;
            ++sortedCount;
        }
    }